

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::ConstantPropagationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,ConstantPropagationCase *this,bool optimized)

{
  bool bVar1;
  CaseShaderType CVar2;
  CaseType CVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000011;
  bool *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_439;
  string constMaybe;
  int numSinRows_2;
  string precision;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int numSinRows_1;
  string statements;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int numSinRows;
  string local_50;
  
  CVar2 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&precision,(_anonymous_namespace_ *)(ulong)CVar2,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  CVar3 = this->m_caseType;
  __s = glcts::fixed_sample_locations_values + 1;
  iVar4 = 1;
  iVar5 = 0xc;
  if (CVar3 == CASETYPE_STRUCT) {
    if (this->m_useConstantExpressionsOnly != false) {
      __s = (bool *)0x1872a48;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&constMaybe,__s,(allocator<char> *)&local_3f0);
    numSinRows_2 = iVar4;
    if (CVar2 == CASESHADERTYPE_VERTEX) {
      numSinRows_2 = iVar5;
    }
    if (optimized) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&statements,
                 "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
                 ,(allocator<char> *)&local_3f0);
    }
    else {
      std::operator+(&local_390,"\tstruct S\n\t{\n\t\t",&precision);
      std::operator+(&local_370,&local_390," vec4 a;\n\t\t");
      std::operator+(&local_350,&local_370,&precision);
      std::operator+(&local_330,&local_350," vec4 b;\n\t\t");
      std::operator+(&local_310,&local_330,&precision);
      std::operator+(&local_2f0,&local_310," vec4 c;\n\t\t");
      std::operator+(&local_3d0,&local_2f0,&precision);
      std::operator+(&local_3b0,&local_3d0," vec4 d;\n\t};\n\n\t");
      std::operator+(&local_2d0,&local_3b0,&constMaybe);
      std::operator+(&local_2b0,&local_2d0,
                     "S s =\n\t\tS(vec4(0.1, 0.5, 0.9, 1.3),\n\t\t  vec4(0.2, 0.6, 1.0, 1.4),\n\t\t  vec4(0.3, 0.7, 1.1, 1.5),\n\t\t  vec4(0.4, 0.8, 1.2, 1.6));\n\t"
                    );
      std::operator+(&local_290,&local_2b0,&constMaybe);
      std::operator+(&local_270,&local_290,&precision);
      std::operator+(&local_250,&local_270," vec4 a = (s.a + s.b + s.c + s.d) * 0.25;\n\t");
      std::operator+(&local_230,&local_250,&constMaybe);
      std::operator+(&local_210,&local_230,&precision);
      std::operator+(&local_1f0,&local_210," vec4 b0 = cos(sin(a));\n");
      std::operator+(&local_b0,"\t",&constMaybe);
      std::operator+(&local_90,&local_b0,&precision);
      std::operator+(&local_d0,&local_90," vec4 b${NDX} = sin(sin(sin(sin(b${PREV_NDX}))));\n");
      iVar4 = numSinRows_2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numSinRows,glcts::fixed_sample_locations_values + 1,&local_439);
      repeatIndexedTemplate((string *)&numSinRows_1,&local_d0,iVar4,(string *)&numSinRows,1);
      std::operator+(&local_1d0,&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numSinRows_1);
      std::operator+(&local_1b0,&local_1d0,"\t");
      std::operator+(&local_190,&local_1b0,&constMaybe);
      std::operator+(&local_170,&local_190,&precision);
      std::operator+(&local_150,&local_170," vec4 c = abs(b");
      de::toString<int>(&local_50,&numSinRows_2);
      std::operator+(&local_130,&local_150,&local_50);
      std::operator+(&local_3f0,&local_130,");\n");
      std::operator+(&statements,&local_3f0,"\tvalue = c*value;\n");
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&numSinRows_1);
      std::__cxx11::string::~string((string *)&numSinRows);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      this_00 = &local_390;
LAB_0114b5ec:
      std::__cxx11::string::~string((string *)this_00);
    }
  }
  else if (CVar3 == CASETYPE_ARRAY) {
    bVar1 = this->m_useConstantExpressionsOnly;
    if (bVar1 != false) {
      __s = (bool *)0x1872a48;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&constMaybe,__s,(allocator<char> *)&local_3f0);
    numSinRows_1 = iVar4;
    if (CVar2 == CASESHADERTYPE_VERTEX) {
      numSinRows_1 = iVar5;
    }
    if (!optimized) {
      if (bVar1 == false) {
        std::operator+(&local_3d0,"\t",&precision);
        std::operator+(&local_3b0,&local_3d0,
                       " vec4 arr[arrLen];\n\tarr[0] = vec4(0.1, 0.5, 0.9, 1.3);\n\tarr[1] = vec4(0.2, 0.6, 1.0, 1.4);\n\tarr[2] = vec4(0.3, 0.7, 1.1, 1.5);\n\tarr[3] = vec4(0.4, 0.8, 1.2, 1.6);\n"
                      );
      }
      else {
        std::operator+(&local_3d0,"\tconst ",&precision);
        std::operator+(&local_3b0,&local_3d0,
                       " vec4 arr[arrLen] =\n\t\tvec4[](vec4(0.1, 0.5, 0.9, 1.3),\n\t\t       vec4(0.2, 0.6, 1.0, 1.4),\n\t\t       vec4(0.3, 0.7, 1.1, 1.5),\n\t\t       vec4(0.4, 0.8, 1.2, 1.6));\n"
                      );
      }
      std::operator+(&local_2d0,"\tconst int arrLen = 4;\n",&local_3b0);
      std::operator+(&local_2b0,&local_2d0,"\t");
      std::operator+(&local_290,&local_2b0,&constMaybe);
      std::operator+(&local_270,&local_290,&precision);
      std::operator+(&local_250,&local_270,
                     " vec4 a = (arr[0] + arr[1] + arr[2] + arr[3]) * (1.0 / float(arr.length()));\n\t"
                    );
      std::operator+(&local_230,&local_250,&constMaybe);
      std::operator+(&local_210,&local_230,&precision);
      std::operator+(&local_1f0,&local_210," vec4 b0 = cos(sin(a));\n");
      std::operator+(&local_350,"\t",&constMaybe);
      std::operator+(&local_330,&local_350,&precision);
      std::operator+(&local_310,&local_330," vec4 b${NDX} = sin(sin(sin(sin(b${PREV_NDX}))));\n");
      iVar4 = numSinRows_1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_d0);
      repeatIndexedTemplate(&local_2f0,&local_310,iVar4,&local_370,1);
      std::operator+(&local_1d0,&local_1f0,&local_2f0);
      std::operator+(&local_1b0,&local_1d0,"\t");
      std::operator+(&local_190,&local_1b0,&constMaybe);
      std::operator+(&local_170,&local_190,&precision);
      std::operator+(&local_150,&local_170," vec4 c = abs(b");
      de::toString<int>(&local_390,&numSinRows_1);
      std::operator+(&local_130,&local_150,&local_390);
      std::operator+(&local_3f0,&local_130,");\n");
      std::operator+(&statements,&local_3f0,"\tvalue = c*value;\n");
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_3b0);
      this_00 = &local_3d0;
      goto LAB_0114b5ec;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&statements,
               "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
               ,(allocator<char> *)&local_3f0);
  }
  else {
    if (CVar3 != CASETYPE_BUILT_IN_FUNCTIONS) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&statements,(char *)0x0,(allocator<char> *)&constMaybe);
      goto LAB_0114b5fb;
    }
    if (this->m_useConstantExpressionsOnly != false) {
      __s = (bool *)0x1872a48;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&constMaybe,__s,(allocator<char> *)&local_3f0);
    numSinRows = iVar4;
    if (CVar2 == CASESHADERTYPE_VERTEX) {
      numSinRows = iVar5;
    }
    if (!optimized) {
      std::operator+(&local_350,"\t",&constMaybe);
      std::operator+(&local_330,&local_350,&precision);
      std::operator+(&local_310,&local_330,
                     " vec4 a = vec4(sin(0.7), cos(0.2), sin(0.9), abs(-0.5));\n\t");
      std::operator+(&local_2f0,&local_310,&constMaybe);
      std::operator+(&local_3d0,&local_2f0,&precision);
      std::operator+(&local_3b0,&local_3d0," vec4 b = cos(a) + fract(3.0*a.xzzw);\n\t");
      std::operator+(&local_2d0,&local_3b0,&constMaybe);
      std::operator+(&local_2b0,&local_2d0,"bvec4 c = bvec4(true, false, true, true);\n\t");
      std::operator+(&local_290,&local_2b0,&constMaybe);
      std::operator+(&local_270,&local_290,&precision);
      std::operator+(&local_250,&local_270," vec4 d = exp(b + vec4(c));\n\t");
      std::operator+(&local_230,&local_250,&constMaybe);
      std::operator+(&local_210,&local_230,&precision);
      std::operator+(&local_1f0,&local_210," vec4 e0 = inversesqrt(mix(d+a, d+b, a));\n");
      std::operator+(&local_d0,"\t",&constMaybe);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numSinRows_1,&local_d0,&precision);
      std::operator+(&local_390,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numSinRows_1," vec4 e${NDX} = sin(sin(sin(sin(e${PREV_NDX}))));\n");
      iVar4 = numSinRows;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_50);
      repeatIndexedTemplate(&local_370,&local_390,iVar4,&local_90,1);
      std::operator+(&local_1d0,&local_1f0,&local_370);
      std::operator+(&local_1b0,&local_1d0,"\t");
      std::operator+(&local_190,&local_1b0,&constMaybe);
      std::operator+(&local_170,&local_190,&precision);
      std::operator+(&local_150,&local_170," vec4 f = abs(e");
      de::toString<int>(&local_b0,&numSinRows);
      std::operator+(&local_130,&local_150,&local_b0);
      std::operator+(&local_3f0,&local_130,");\n");
      std::operator+(&statements,&local_3f0,"\tvalue = f*value;\n");
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&numSinRows_1);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      this_00 = &local_350;
      goto LAB_0114b5ec;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&statements,
               "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
               ,(allocator<char> *)&local_3f0);
  }
  std::__cxx11::string::~string((string *)&constMaybe);
LAB_0114b5fb:
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     &statements);
  std::__cxx11::string::~string((string *)&statements);
  std::__cxx11::string::~string((string *)&precision);
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_BUILT_IN_FUNCTIONS		? builtinFunctionsCaseStatements	(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_ARRAY					? arrayCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_STRUCT					? structCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}